

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O2

char * __thiscall Messages::Person::_InternalParse(Person *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  string *s;
  Person_PhoneNumber *msg;
  uint64 uVar2;
  uint uVar3;
  char *field_name;
  UnknownFieldSet *pUVar4;
  char cVar5;
  ulong uVar6;
  uint32 tag;
  char *local_48;
  uint local_3c;
  InternalMetadata *local_38;
  
  local_38 = (InternalMetadata *)&this->field_0x8;
  uVar3 = 0;
  local_48 = ptr;
LAB_00109470:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_48);
    if (bVar1) goto LAB_001095ee;
    local_48 = google::protobuf::internal::ReadTag(local_48,&local_3c,0);
    if (local_48 == (char *)0x0) goto LAB_00109609;
    uVar6 = (ulong)local_3c;
    cVar5 = (char)local_3c;
    switch(local_3c >> 3) {
    case 1:
      if (cVar5 != '\n') break;
      s = _internal_mutable_name_abi_cxx11_(this);
      local_48 = (char *)google::protobuf::internal::InlineGreedyStringParser
                                   ((string *)s,local_48,ctx);
      field_name = "Messages.Person.name";
LAB_00109525:
      google::protobuf::internal::VerifyUTF8(s,field_name);
      goto joined_r0x0010958c;
    case 2:
      if (cVar5 == '\x10') {
        uVar3 = 4;
        uVar2 = google::protobuf::internal::ReadVarint64(&local_48);
        this->id_ = (int32)uVar2;
        goto joined_r0x0010958c;
      }
      break;
    case 3:
      if (cVar5 == '\x1a') {
        s = _internal_mutable_email_abi_cxx11_(this);
        local_48 = (char *)google::protobuf::internal::InlineGreedyStringParser
                                     ((string *)s,local_48,ctx);
        field_name = "Messages.Person.email";
        goto LAB_00109525;
      }
      break;
    case 4:
      if (cVar5 == '\"') {
        local_48 = local_48 + -1;
        do {
          local_48 = local_48 + 1;
          msg = google::protobuf::RepeatedPtrField<Messages::Person_PhoneNumber>::Add
                          (&this->phones_);
          local_48 = google::protobuf::internal::ParseContext::
                     ParseMessage<Messages::Person_PhoneNumber>(ctx,msg,local_48);
          if (local_48 == (char *)0x0) goto LAB_00109609;
        } while ((local_48 < *(char **)ctx) && (*local_48 == '\"'));
        goto LAB_00109470;
      }
    }
    if ((uVar6 == 0) || ((local_3c & 7) == 4)) {
      *(uint *)&ctx->field_0x50 = local_3c - 1;
      goto LAB_001095ee;
    }
    if (((ulong)local_38->ptr_ & 1) == 0) {
      pUVar4 = google::protobuf::internal::InternalMetadata::
               mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(local_38);
    }
    else {
      pUVar4 = (UnknownFieldSet *)(((ulong)local_38->ptr_ & 0xfffffffffffffffe) + 8);
    }
    local_48 = (char *)google::protobuf::internal::UnknownFieldParse(uVar6,pUVar4,local_48,ctx);
joined_r0x0010958c:
    if (local_48 == (char *)0x0) {
LAB_00109609:
      local_48 = (char *)0x0;
LAB_001095ee:
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar3;
      return local_48;
    }
  } while( true );
}

Assistant:

const char* Person::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // required string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "Messages.Person.name");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // required int32 id = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_id(&has_bits);
          id_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string email = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          auto str = _internal_mutable_email();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "Messages.Person.email");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .Messages.Person.PhoneNumber phones = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_phones(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<34>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}